

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LoadIniSettingsFromDisk(char *ini_filename)

{
  int *piVar1;
  char *ini_data;
  size_t file_data_size;
  size_t local_10;
  
  local_10 = 0;
  ini_data = (char *)ImFileLoadToMemory(ini_filename,"rb",&local_10,0);
  if (ini_data != (char *)0x0) {
    LoadIniSettingsFromMemory(ini_data,local_10);
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(ini_data,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromDisk(const char* ini_filename)
{
    size_t file_data_size = 0;
    char* file_data = (char*)ImFileLoadToMemory(ini_filename, "rb", &file_data_size);
    if (!file_data)
        return;
    LoadIniSettingsFromMemory(file_data, (size_t)file_data_size);
    ImGui::MemFree(file_data);
}